

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O3

bool absl::lts_20240722::debugging_internal::ParseType(State *state)

{
  ParseState *pPVar1;
  uint uVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ComplexityGuard guard;
  char *pcVar12;
  undefined8 *puVar13;
  ParseState copy;
  int number;
  ulong local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  iVar9 = state->recursion_depth;
  iVar10 = state->steps;
  state->recursion_depth = iVar9 + 1;
  state->steps = iVar10 + 1;
  if (0x1ffff < iVar10 || 0xff < iVar9) {
    bVar7 = false;
    goto LAB_001045ba;
  }
  uVar4 = (state->parse_state).mangled_idx;
  uVar5 = (state->parse_state).out_cur_idx;
  uVar6 = *(undefined8 *)&(state->parse_state).prev_name_idx;
  bVar7 = ParseCVQualifiers(state);
  pPVar1 = &state->parse_state;
  if (bVar7) {
    bVar8 = ParseType(state);
LAB_001045a4:
    bVar7 = true;
    if (bVar8 == false) {
      pPVar1->mangled_idx = uVar4;
      pPVar1->out_cur_idx = uVar5;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
      bVar7 = false;
    }
  }
  else {
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseCharClass(state,"OPRCG");
    if (bVar7) {
      bVar8 = ParseType(state);
      goto LAB_001045a4;
    }
    pPVar1->mangled_idx = uVar4;
    pPVar1->out_cur_idx = uVar5;
    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
    bVar7 = ParseTwoCharToken(state,"Dp");
    if (bVar7) {
      bVar8 = ParseType(state);
      bVar7 = true;
      if (!bVar8) goto LAB_001045f4;
    }
    else {
LAB_001045f4:
      pPVar1->mangled_idx = uVar4;
      pPVar1->out_cur_idx = uVar5;
      *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
      iVar10 = state->recursion_depth;
      iVar11 = state->steps;
      iVar9 = iVar10 + 1;
      state->recursion_depth = iVar9;
      state->steps = iVar11 + 1;
      if (iVar11 < 0x20000 && iVar10 < 0x100) {
        bVar7 = ParseTwoCharToken(state,"DB");
        if (!bVar7) {
          bVar7 = ParseTwoCharToken(state,"DU");
          if (bVar7) {
            MaybeAppend(state,"unsigned ");
            goto LAB_00104662;
          }
          bVar7 = ParseTwoCharToken(state,"DF");
          if (bVar7) {
            bVar7 = ParseThreeCharToken(state,"16b");
            if (bVar7) {
              pcVar12 = "std::bfloat16_t";
              goto LAB_00104794;
            }
            local_48 = local_48 & 0xffffffff00000000;
            bVar7 = ParseNumber(state,(int *)&local_48);
            if (!bVar7) goto LAB_00104809;
            MaybeAppend(state,"_Float");
            MaybeAppendDecimal(state,(int)local_48);
            bVar7 = ParseOneCharToken(state,'x');
            if (bVar7) {
              pcVar12 = "x";
              goto LAB_00104794;
            }
            bVar7 = ParseOneCharToken(state,'_');
            if (!bVar7) goto LAB_00104809;
            goto LAB_0010479c;
          }
          pcVar12 = "v";
          puVar13 = (undefined8 *)(kBuiltinTypeList + 8);
          do {
            if (pcVar12[1] == '\0') {
              bVar7 = ParseOneCharToken(state,*pcVar12);
LAB_00104748:
              if (bVar7 != false) {
                pcVar12 = (char *)*puVar13;
                goto LAB_00104794;
              }
            }
            else if (pcVar12[2] == '\0') {
              bVar7 = ParseTwoCharToken(state,pcVar12);
              goto LAB_00104748;
            }
            pcVar12 = (char *)puVar13[2];
            puVar13 = puVar13 + 3;
          } while (pcVar12 != (char *)0x0);
          bVar8 = ParseVendorExtendedType(state);
          iVar9 = state->recursion_depth;
          state->recursion_depth = iVar9 + -1;
          bVar7 = true;
          if (bVar8) goto LAB_001045b5;
          goto LAB_0010481a;
        }
LAB_00104662:
        uVar2 = *(uint *)&(state->parse_state).field_0xc;
        *(uint *)&(state->parse_state).field_0xc = uVar2 & 0x7fffffff;
        local_48 = CONCAT44(local_48._4_4_,0xffffffff);
        bVar7 = ParseNumber(state,(int *)&local_48);
        if ((!bVar7) && (bVar7 = ParseExpression(state), !bVar7)) {
LAB_00104809:
          pPVar1->mangled_idx = uVar4;
          pPVar1->out_cur_idx = uVar5;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
          iVar9 = state->recursion_depth;
          iVar10 = iVar9 + -1;
          goto LAB_00104817;
        }
        *(uint *)&(state->parse_state).field_0xc =
             *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar2 & 0x80000000;
        bVar7 = ParseOneCharToken(state,'_');
        if (!bVar7) goto LAB_00104809;
        MaybeAppend(state,"_BitInt(");
        if ((int)local_48 < 0) {
          MaybeAppend(state,"?");
        }
        else {
          MaybeAppendDecimal(state,(int)local_48);
        }
        pcVar12 = ")";
LAB_00104794:
        MaybeAppend(state,pcVar12);
LAB_0010479c:
        state->recursion_depth = state->recursion_depth + -1;
        bVar7 = true;
      }
      else {
LAB_00104817:
        state->recursion_depth = iVar10;
LAB_0010481a:
        state->recursion_depth = iVar9;
        iVar10 = state->steps;
        state->steps = iVar10 + 1;
        if (iVar10 < 0x20000 && iVar9 < 0x101) {
          local_38._0_4_ = pPVar1->mangled_idx;
          local_38._4_4_ = pPVar1->out_cur_idx;
          uStack_30 = *(undefined8 *)&(state->parse_state).prev_name_idx;
          state->recursion_depth = iVar9 + 1;
          state->steps = iVar10 + 2;
          if ((iVar10 < 0x1ffff && iVar9 < 0x100) && (bVar7 = ParseTwoCharToken(state,"Do"), !bVar7)
             ) {
            local_48._0_4_ = pPVar1->mangled_idx;
            local_48._4_4_ = pPVar1->out_cur_idx;
            uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
            bVar7 = ParseTwoCharToken(state,"DO");
            if ((!bVar7) ||
               ((bVar7 = ParseExpression(state), !bVar7 ||
                (bVar7 = ParseOneCharToken(state,'E'), !bVar7)))) {
              pPVar1->mangled_idx = (int)local_48;
              pPVar1->out_cur_idx = local_48._4_4_;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              bVar7 = ParseTwoCharToken(state,"Dw");
              if ((bVar7) && (bVar7 = ParseType(state), bVar7)) {
                do {
                  bVar7 = ParseType(state);
                } while (bVar7);
                bVar7 = ParseOneCharToken(state,'E');
                if (bVar7) goto LAB_0010490d;
              }
              pPVar1->mangled_idx = (int)local_48;
              pPVar1->out_cur_idx = local_48._4_4_;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
            }
          }
LAB_0010490d:
          state->recursion_depth = state->recursion_depth + -1;
          ParseTwoCharToken(state,"Dx");
          bVar7 = ParseOneCharToken(state,'F');
          if (bVar7) {
            ParseOneCharToken(state,'Y');
            bVar7 = ParseBareFunctionType(state);
            if (bVar7) {
              ParseCharClass(state,"RO");
              bVar7 = ParseOneCharToken(state,'E');
              if (bVar7) goto LAB_0010479c;
            }
          }
          pPVar1->mangled_idx = (undefined4)local_38;
          pPVar1->out_cur_idx = local_38._4_4_;
          *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_30;
          iVar9 = state->recursion_depth;
        }
        state->recursion_depth = iVar9 + -1;
        bVar8 = ParseClassEnumType(state);
        bVar7 = true;
        if (!bVar8) {
          iVar11 = state->recursion_depth;
          iVar3 = state->steps;
          iVar9 = iVar11 + 1;
          state->recursion_depth = iVar9;
          iVar10 = iVar3 + 1;
          state->steps = iVar10;
          if (iVar3 < 0x20000 && iVar11 < 0x100) {
            local_48._0_4_ = pPVar1->mangled_idx;
            local_48._4_4_ = pPVar1->out_cur_idx;
            uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
            bVar8 = ParseOneCharToken(state,'A');
            if ((((!bVar8) || (bVar8 = ParseNumber(state,(int *)0x0), !bVar8)) ||
                (bVar8 = ParseOneCharToken(state,'_'), !bVar8)) ||
               (bVar8 = ParseType(state), !bVar8)) {
              pPVar1->mangled_idx = (int)local_48;
              pPVar1->out_cur_idx = local_48._4_4_;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              bVar8 = ParseOneCharToken(state,'A');
              if (bVar8) {
                ParseExpression(state);
                bVar8 = ParseOneCharToken(state,'_');
                if ((bVar8) && (bVar8 = ParseType(state), bVar8)) goto LAB_00104aa9;
              }
              pPVar1->mangled_idx = (int)local_48;
              pPVar1->out_cur_idx = local_48._4_4_;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              iVar9 = state->recursion_depth;
              iVar10 = state->steps;
              iVar11 = iVar9 + -1;
              goto LAB_00104a59;
            }
LAB_00104aa9:
            state->recursion_depth = state->recursion_depth + -1;
          }
          else {
LAB_00104a59:
            state->recursion_depth = iVar9;
            state->steps = iVar10 + 1;
            if (iVar10 < 0x20000 && iVar11 < 0x100) {
              local_48._0_4_ = pPVar1->mangled_idx;
              local_48._4_4_ = pPVar1->out_cur_idx;
              uStack_40 = *(undefined8 *)&(state->parse_state).prev_name_idx;
              bVar8 = ParseOneCharToken(state,'M');
              if (((bVar8) && (bVar8 = ParseType(state), bVar8)) &&
                 (bVar8 = ParseType(state), bVar8)) goto LAB_00104aa9;
              pPVar1->mangled_idx = (int)local_48;
              pPVar1->out_cur_idx = local_48._4_4_;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uStack_40;
              iVar11 = state->recursion_depth + -1;
            }
            state->recursion_depth = iVar11;
            bVar8 = ParseDecltype(state);
            if (((!bVar8) && (bVar8 = ParseSubstitution(state,false), !bVar8)) &&
               ((bVar8 = ParseTemplateTemplateParam(state), !bVar8 ||
                (bVar8 = ParseTemplateArgs(state), !bVar8)))) {
              pPVar1->mangled_idx = uVar4;
              pPVar1->out_cur_idx = uVar5;
              *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
              bVar8 = ParseTemplateParam(state);
              if ((!bVar8) &&
                 ((((bVar8 = ParseTwoCharToken(state,"Dv"), !bVar8 ||
                    (bVar8 = ParseNumber(state,(int *)0x0), !bVar8)) ||
                   (bVar8 = ParseOneCharToken(state,'_'), !bVar8)) ||
                  (bVar8 = ParseType(state), !bVar8)))) {
                pPVar1->mangled_idx = uVar4;
                pPVar1->out_cur_idx = uVar5;
                *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
                bVar8 = ParseTwoCharToken(state,"Dv");
                if (((!bVar8) || (bVar8 = ParseExpression(state), !bVar8)) ||
                   ((bVar8 = ParseOneCharToken(state,'_'), !bVar8 ||
                    (bVar8 = ParseType(state), !bVar8)))) {
                  pPVar1->mangled_idx = uVar4;
                  pPVar1->out_cur_idx = uVar5;
                  *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
                  pcVar12 = "Dk";
                  bVar8 = ParseTwoCharToken(state,"Dk");
                  if ((!bVar8) || (bVar8 = ParseName(state), !bVar8)) {
                    pPVar1->mangled_idx = uVar4;
                    pPVar1->out_cur_idx = uVar5;
                    *(undefined8 *)&(state->parse_state).prev_name_idx = uVar6;
                    bVar7 = ParseLongToken(state,pcVar12);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001045b5:
  iVar9 = state->recursion_depth + -1;
LAB_001045ba:
  state->recursion_depth = iVar9;
  return bVar7;
}

Assistant:

static bool ParseType(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  ParseState copy = state->parse_state;

  // We should check CV-qualifers, and PRGC things first.
  //
  // CV-qualifiers overlap with some operator names, but an operator name is not
  // valid as a type.  To avoid an ambiguity that can lead to exponential time
  // complexity, refuse to backtrack the CV-qualifiers.
  //
  // _Z4aoeuIrMvvE
  //  => _Z 4aoeuI        rM  v     v   E
  //         aoeu<operator%=, void, void>
  //  => _Z 4aoeuI r Mv v              E
  //         aoeu<void void::* restrict>
  //
  // By consuming the CV-qualifiers first, the former parse is disabled.
  if (ParseCVQualifiers(state)) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  // Similarly, these tag characters can overlap with other <name>s resulting in
  // two different parse prefixes that land on <template-args> in the same
  // place, such as "C3r1xI...".  So, disable the "ctor-name = C3" parse by
  // refusing to backtrack the tag characters.
  if (ParseCharClass(state, "OPRCG")) {
    const bool result = ParseType(state);
    if (!result) state->parse_state = copy;
    return result;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dp") && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseBuiltinType(state) || ParseFunctionType(state) ||
      ParseClassEnumType(state) || ParseArrayType(state) ||
      ParsePointerToMemberType(state) || ParseDecltype(state) ||
      // "std" on its own isn't a type.
      ParseSubstitution(state, /*accept_std=*/false)) {
    return true;
  }

  if (ParseTemplateTemplateParam(state) && ParseTemplateArgs(state)) {
    return true;
  }
  state->parse_state = copy;

  // Less greedy than <template-template-param> <template-args>.
  if (ParseTemplateParam(state)) {
    return true;
  }

  // GNU vector extension Dv <number> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseNumber(state, nullptr) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  // GNU vector extension Dv <expression> _ <type>
  if (ParseTwoCharToken(state, "Dv") && ParseExpression(state) &&
      ParseOneCharToken(state, '_') && ParseType(state)) {
    return true;
  }
  state->parse_state = copy;

  if (ParseTwoCharToken(state, "Dk") && ParseTypeConstraint(state)) {
    return true;
  }
  state->parse_state = copy;

  // For this notation see CXXNameMangler::mangleType in Clang's source code.
  // The relevant logic and its comment "not clear how to mangle this!" date
  // from 2011, so it may be with us awhile.
  return ParseLongToken(state, "_SUBSTPACK_");
}